

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O3

stack_item * stack_peek_n(stack *stack,size_t index)

{
  stack_item *psVar1;
  stack_item *psVar2;
  
  psVar1 = stack->head;
  if ((psVar1 == (stack_item *)0x0) || (stack->length < index)) {
    psVar1 = (stack_item *)0x0;
  }
  else {
    psVar2 = psVar1;
    if (index != 0) {
      do {
        psVar1 = psVar2->next;
        if (psVar1 == (stack_item *)0x0) {
          return psVar2;
        }
        index = index - 1;
        psVar2 = psVar1;
      } while (index != 0);
    }
  }
  return psVar1;
}

Assistant:

const struct stack_item *stack_peek_n(const struct stack *stack, size_t index)
{
        if (!stack_has_item(stack) || stack->length < index) {
                return NULL;
        }

        struct stack_item *curr = stack->head;
        size_t i = 0;

        while (i < index && curr != NULL && curr->next != NULL) {
                curr = curr->next;

                ++i;
        }

        return curr;
}